

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O2

void __thiscall
google::protobuf::util::FieldMaskUtil::FromString
          (FieldMaskUtil *this,string_view str,FieldMask *out)

{
  pointer pbVar1;
  string_view path;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  paths;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_58;
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_38;
  
  FieldMask::Clear((FieldMask *)str._M_str);
  local_58.delimiter_.c_ = ',';
  local_58.text_._M_len = (size_t)this;
  local_58.text_._M_str = (char *)str._M_len;
  absl::lts_20250127::strings_internal::
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  operator_vector<std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_nullptr>
            ((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              *)&local_38,&local_58);
  for (pbVar1 = local_38._M_impl.super__Vector_impl_data._M_start;
      pbVar1 != local_38._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
    local_58.text_._M_len = pbVar1->_M_len;
    local_58.text_._M_str = pbVar1->_M_str;
    if ((FieldMaskUtil *)local_58.text_._M_len != (FieldMaskUtil *)0x0) {
      internal::AddToRepeatedPtrField<std::basic_string_view<char,std::char_traits<char>>&>
                (&(((FieldMask *)str._M_str)->field_0)._impl_.paths_,&local_58.text_);
    }
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&local_38);
  return;
}

Assistant:

void FieldMaskUtil::FromString(absl::string_view str, FieldMask* out) {
  out->Clear();
  std::vector<absl::string_view> paths = absl::StrSplit(str, ',');
  for (absl::string_view path : paths) {
    if (path.empty()) continue;
    out->add_paths(path);
  }
}